

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_IDAT(ucvector *out,uchar *data,size_t datasize,LodePNGCompressSettings *zlibsettings)

{
  uint uVar1;
  uchar *local_38;
  size_t asStack_30 [3];
  
  local_38 = (uchar *)0x0;
  asStack_30[0] = 0;
  asStack_30[1] = 0;
  if (zlibsettings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    uVar1 = lodepng_zlib_compress(&local_38,asStack_30,data,datasize,zlibsettings);
  }
  else {
    uVar1 = (*zlibsettings->custom_zlib)(&local_38,asStack_30,data,datasize,zlibsettings);
  }
  if (uVar1 == 0) {
    uVar1 = lodepng_chunk_create(&out->data,&out->size,(uint)asStack_30[0],"IDAT",local_38);
    if (uVar1 == 0) {
      uVar1 = 0;
      out->allocsize = out->size;
    }
  }
  asStack_30[0] = 0;
  asStack_30[1] = 0;
  free(local_38);
  return uVar1;
}

Assistant:

static unsigned addChunk_IDAT(ucvector* out, const unsigned char* data, size_t datasize,
                              LodePNGCompressSettings* zlibsettings)
{
  ucvector zlibdata;
  unsigned error = 0;

  /*compress with the Zlib compressor*/
  ucvector_init(&zlibdata);
  error = zlib_compress(&zlibdata.data, &zlibdata.size, data, datasize, zlibsettings);
  if(!error) error = addChunk(out, "IDAT", zlibdata.data, zlibdata.size);
  ucvector_cleanup(&zlibdata);

  return error;
}